

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

size_t __thiscall proto2_unittest::TestDynamicExtensions::ByteSizeLong(TestDynamicExtensions *this)

{
  int iVar1;
  anon_union_88_1_493b367e_for_TestDynamicExtensions_10 aVar2;
  uint uVar3;
  uint uVar4;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar5;
  size_t sVar6;
  ulong uVar7;
  uint index;
  int n;
  size_t sVar8;
  long lVar9;
  
  uVar4 = *(uint *)((long)&this->field_0 + 0x10);
  lVar9 = (ulong)uVar4 * 2;
  if (0 < (int)uVar4) {
    index = 0;
    do {
      pVVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.repeated_extension_.super_RepeatedPtrFieldBase,
                          index);
      uVar3 = (uint)pVVar5->_M_string_length | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      lVar9 = lVar9 + pVVar5->_M_string_length + (ulong)(iVar1 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar4 != index);
  }
  sVar6 = google::protobuf::internal::WireFormatLite::SInt32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.packed_extension_,2,
                     &(this->field_0)._impl_._packed_extension_cached_byte_size_);
  aVar2 = this->field_0;
  sVar8 = sVar6 + 6;
  if (((undefined1  [88])aVar2 & (undefined1  [88])0x4) == (undefined1  [88])0x0) {
    sVar8 = sVar6;
  }
  sVar8 = sVar8 + lVar9;
  if (((undefined1  [88])aVar2 & (undefined1  [88])0x1b) != (undefined1  [88])0x0) {
    if (((undefined1  [88])aVar2 & (undefined1  [88])0x1) != (undefined1  [88])0x0) {
      sVar6 = ForeignMessage::ByteSizeLong((this->field_0)._impl_.message_extension_);
      uVar4 = (uint)sVar6 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar8 = sVar8 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if (((undefined1  [88])aVar2 & (undefined1  [88])0x2) != (undefined1  [88])0x0) {
      sVar6 = TestDynamicExtensions_DynamicMessageType::ByteSizeLong
                        ((this->field_0)._impl_.dynamic_message_extension_);
      uVar4 = (uint)sVar6 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar8 = sVar8 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if (((undefined1  [88])aVar2 & (undefined1  [88])0x8) != (undefined1  [88])0x0) {
      uVar7 = (long)(this->field_0)._impl_.enum_extension_ | 1;
      lVar9 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      sVar8 = sVar8 + ((int)lVar9 * 9 + 0x49U >> 6) + 2;
    }
    if (((undefined1  [88])aVar2 & (undefined1  [88])0x10) != (undefined1  [88])0x0) {
      uVar7 = (long)(this->field_0)._impl_.dynamic_enum_extension_ | 1;
      lVar9 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      sVar8 = sVar8 + ((int)lVar9 * 9 + 0x49U >> 6) + 2;
    }
  }
  sVar8 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar8,&(this->field_0)._impl_._cached_size_);
  return sVar8;
}

Assistant:

::size_t TestDynamicExtensions::ByteSizeLong() const {
  const TestDynamicExtensions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestDynamicExtensions)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated string repeated_extension = 2005;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_extension().size());
      for (int i = 0, n = this_._internal_repeated_extension().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_extension().Get(i));
      }
    }
    // repeated sint32 packed_extension = 2006 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt32SizeWithPackedTagSize(
              this_._internal_packed_extension(), 2,
              this_._impl_._packed_extension_cached_byte_size_);
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000004u & cached_has_bits) * 6;
  if ((cached_has_bits & 0x0000001bu) != 0) {
    // .proto2_unittest.ForeignMessage message_extension = 2003;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.message_extension_);
    }
    // .proto2_unittest.TestDynamicExtensions.DynamicMessageType dynamic_message_extension = 2004;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.dynamic_message_extension_);
    }
    // .proto2_unittest.ForeignEnum enum_extension = 2001;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_enum_extension());
    }
    // .proto2_unittest.TestDynamicExtensions.DynamicEnumType dynamic_enum_extension = 2002;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_dynamic_enum_extension());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}